

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O0

vrna_exp_param_t * get_exp_params_ali(vrna_md_t *md,uint n_seq,double pfs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vrna_exp_param_t *pvVar4;
  size_t sVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_290;
  double local_280;
  double local_270;
  double local_268;
  double local_260;
  double local_258;
  double local_250;
  double local_248;
  double local_240;
  double local_230;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1a8;
  double local_198;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_148;
  double local_138;
  double local_130;
  double local_120;
  double local_110;
  double local_100;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  int local_74;
  int local_70;
  int n;
  int m_1;
  int m;
  double GQuadBeta_T;
  double GQuadAlpha_T;
  vrna_exp_param_t *pf;
  double GT;
  double TT;
  double kTn;
  uint local_30;
  int pf_smooth;
  uint l;
  uint k;
  uint j;
  uint i;
  double pfs_local;
  uint n_seq_local;
  vrna_md_t *md_local;
  
  pvVar4 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memcpy(&pvVar4->model_details,md,0x7e8);
  pvVar4->alpha = md->betaScale;
  pvVar4->temperature = md->temperature;
  pvVar4->pf_scale = pfs;
  dVar6 = (double)n_seq * md->betaScale * (md->temperature + 273.15) * 1.98717;
  pvVar4->kT = dVar6;
  iVar1 = md->pf_smooth;
  dVar7 = (md->temperature + 273.15) / Tmeasure;
  pvVar4->lxc = lxc37 * dVar7;
  if (iVar1 == 0) {
    local_80 = (double)(int)(-(double)(DuplexInitdH - DuplexInit37) * dVar7 + (double)DuplexInitdH);
  }
  else {
    local_80 = -(double)(DuplexInitdH - DuplexInit37) * dVar7 + (double)DuplexInitdH;
  }
  dVar8 = exp((-local_80 * 10.0) / dVar6);
  pvVar4->expDuplexInit = dVar8;
  if (iVar1 == 0) {
    local_88 = (double)(int)(-(double)(TerminalAUdH - TerminalAU37) * dVar7 + (double)TerminalAUdH);
  }
  else {
    local_88 = -(double)(TerminalAUdH - TerminalAU37) * dVar7 + (double)TerminalAUdH;
  }
  dVar8 = exp((-local_88 * 10.0) / dVar6);
  pvVar4->expTermAU = dVar8;
  if (iVar1 == 0) {
    local_90 = (double)(int)(-(double)(ML_BASEdH - ML_BASE37) * dVar7 + (double)ML_BASEdH);
  }
  else {
    local_90 = -(double)(ML_BASEdH - ML_BASE37) * dVar7 + (double)ML_BASEdH;
  }
  dVar8 = exp(((local_90 * -10.0) / dVar6) / (double)n_seq);
  pvVar4->expMLbase = dVar8;
  if (iVar1 == 0) {
    local_98 = (double)(int)(-(double)(ML_closingdH - ML_closing37) * dVar7 + (double)ML_closingdH);
  }
  else {
    local_98 = -(double)(ML_closingdH - ML_closing37) * dVar7 + (double)ML_closingdH;
  }
  dVar8 = exp((-local_98 * 10.0) / dVar6);
  pvVar4->expMLclosing = dVar8;
  if (iVar1 == 0) {
    local_a0 = (double)(int)(-(double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar7 +
                            (double)GQuadLayerMismatchH);
  }
  else {
    local_a0 = -(double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar7 +
               (double)GQuadLayerMismatchH;
  }
  dVar8 = exp((-local_a0 * 10.0) / dVar6);
  pvVar4->expgquadLayerMismatch = dVar8;
  pvVar4->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  for (k = 2; k < 8; k = k + 1) {
    for (l = 3; l < 0x2e; l = l + 1) {
      dVar8 = (double)GQuadAlphadH;
      iVar2 = GQuadAlphadH - GQuadAlpha37;
      dVar9 = (double)GQuadBetadH;
      iVar3 = GQuadBetadH - GQuadBeta37;
      dVar10 = log((double)l - 2.0);
      local_c0 = (dVar8 - (double)iVar2 * dVar7) * (double)(k - 1) +
                 (dVar9 - (double)iVar3 * dVar7) * dVar10;
      if (iVar1 == 0) {
        local_c0 = (double)(int)local_c0;
      }
      dVar8 = exp((-local_c0 * 10.0) / dVar6);
      pvVar4->expgquad[k][l] = dVar8;
    }
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      local_c8 = (double)(int)(-(double)(hairpindH[k] - hairpin37[k]) * dVar7 + (double)hairpindH[k]
                              );
    }
    else {
      local_c8 = -(double)(hairpindH[k] - hairpin37[k]) * dVar7 + (double)hairpindH[k];
    }
    dVar8 = exp((-local_c8 * 10.0) / dVar6);
    pvVar4->exphairpin[k] = dVar8;
  }
  for (k = 0; k < 3; k = k + 1) {
    dVar8 = exp((-(dVar7 * 600.0) * 10.0) / dVar6);
    pvVar4->exphairpin[k] = dVar8;
  }
  for (k = 0; k < 0x1f; k = k + 1) {
    if (iVar1 == 0) {
      local_d0 = (double)(int)(-(double)(bulgedH[k] - bulge37[k]) * dVar7 + (double)bulgedH[k]);
    }
    else {
      local_d0 = -(double)(bulgedH[k] - bulge37[k]) * dVar7 + (double)bulgedH[k];
    }
    dVar8 = exp((-local_d0 * 10.0) / dVar6);
    pvVar4->expbulge[k] = dVar8;
    if (iVar1 == 0) {
      local_d8 = (double)(int)(-(double)(internal_loopdH[k] - internal_loop37[k]) * dVar7 +
                              (double)internal_loopdH[k]);
    }
    else {
      local_d8 = -(double)(internal_loopdH[k] - internal_loop37[k]) * dVar7 +
                 (double)internal_loopdH[k];
    }
    dVar8 = exp((-local_d8 * 10.0) / dVar6);
    pvVar4->expinternal[k] = dVar8;
  }
  if (james_rule != 0) {
    dVar8 = exp(-800.0 / dVar6);
    pvVar4->expinternal[2] = dVar8;
  }
  dVar8 = (double)bulgedH[0x1e];
  iVar2 = bulgedH[0x1e] - bulge37[0x1e];
  for (k = 0x1f; k < 0x1f; k = k + 1) {
    dVar9 = pvVar4->lxc;
    dVar10 = log((double)k / 30.0);
    dVar9 = exp((-(dVar9 * dVar10 + -(double)iVar2 * dVar7 + dVar8) * 10.0) / dVar6);
    pvVar4->expbulge[k] = dVar9;
  }
  dVar8 = (double)internal_loopdH[0x1e];
  iVar2 = internal_loopdH[0x1e] - internal_loop37[0x1e];
  for (k = 0x1f; k < 0x1f; k = k + 1) {
    dVar9 = pvVar4->lxc;
    dVar10 = log((double)k / 30.0);
    dVar9 = exp((-(dVar9 * dVar10 + -(double)iVar2 * dVar7 + dVar8) * 10.0) / dVar6);
    pvVar4->expinternal[k] = dVar9;
  }
  dVar8 = -(double)(niniodH - ninio37) * dVar7 + (double)niniodH;
  for (l = 0; l < 0x1f; l = l + 1) {
    if ((double)l * dVar8 <= (double)MAX_NINIO) {
      local_100 = (double)l * dVar8;
    }
    else {
      local_100 = (double)MAX_NINIO;
    }
    dVar9 = exp((-local_100 * 10.0) / dVar6);
    pvVar4->expninio[2][l] = dVar9;
  }
  for (k = 0; sVar5 = strlen(Tetraloops), k * 7 < sVar5; k = k + 1) {
    if (iVar1 == 0) {
      local_110 = (double)(int)(-(double)(TetraloopdH[k] - Tetraloop37[k]) * dVar7 +
                               (double)TetraloopdH[k]);
    }
    else {
      local_110 = -(double)(TetraloopdH[k] - Tetraloop37[k]) * dVar7 + (double)TetraloopdH[k];
    }
    dVar8 = exp((-local_110 * 10.0) / dVar6);
    pvVar4->exptetra[k] = dVar8;
  }
  for (k = 0; sVar5 = strlen(Triloops), k * 5 < sVar5; k = k + 1) {
    if (iVar1 == 0) {
      local_120 = (double)(int)(-(double)(TriloopdH[k] - Triloop37[k]) * dVar7 +
                               (double)TriloopdH[k]);
    }
    else {
      local_120 = -(double)(TriloopdH[k] - Triloop37[k]) * dVar7 + (double)TriloopdH[k];
    }
    dVar8 = exp((-local_120 * 10.0) / dVar6);
    pvVar4->exptri[k] = dVar8;
  }
  for (k = 0; sVar5 = strlen(Hexaloops), k * 9 < sVar5; k = k + 1) {
    if (iVar1 == 0) {
      local_130 = (double)(int)(-(double)(HexaloopdH[k] - Hexaloop37[k]) * dVar7 +
                               (double)HexaloopdH[k]);
    }
    else {
      local_130 = -(double)(HexaloopdH[k] - Hexaloop37[k]) * dVar7 + (double)HexaloopdH[k];
    }
    dVar8 = exp((-local_130 * 10.0) / dVar6);
    pvVar4->exphex[k] = dVar8;
  }
  for (k = 0; k < 8; k = k + 1) {
    if (iVar1 == 0) {
      local_138 = (double)(int)(-(double)(ML_interndH - ML_intern37) * dVar7 + (double)ML_interndH);
    }
    else {
      local_138 = -(double)(ML_interndH - ML_intern37) * dVar7 + (double)ML_interndH;
    }
    dVar8 = exp((-local_138 * 10.0) / dVar6);
    pvVar4->expMLintern[k] = dVar8;
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      if (md->dangles == 0) {
        pvVar4->expdangle5[k][l] = 1.0;
        pvVar4->expdangle3[k][l] = 1.0;
      }
      else {
        if (iVar1 == 0) {
          if (0.0 <= -(double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                   (double)dangle5_dH[k][l])) {
            local_148 = -(double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                      (double)dangle5_dH[k][l]);
          }
          else {
            local_148 = 0.0;
          }
          local_158 = local_148;
        }
        else {
          if (iVar1 == 0) {
            local_160 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                     (double)dangle5_dH[k][l]);
          }
          else {
            local_160 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                        (double)dangle5_dH[k][l];
          }
          if (-1.2283697 <= -local_160 / 10.0) {
            if (iVar1 == 0) {
              local_170 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                       (double)dangle5_dH[k][l]);
            }
            else {
              local_170 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                          (double)dangle5_dH[k][l];
            }
            if (-local_170 / 10.0 <= 0.8660254) {
              if (iVar1 == 0) {
                local_188 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_188 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                            (double)dangle5_dH[k][l];
              }
              dVar8 = sin(-local_188 / 10.0 - 0.34242663);
              if (iVar1 == 0) {
                local_198 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_198 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                            (double)dangle5_dH[k][l];
              }
              dVar9 = sin(-local_198 / 10.0 - 0.34242663);
              local_180 = (dVar8 + 1.0) * 3.8490018 * (dVar9 + 1.0);
            }
            else {
              if (iVar1 == 0) {
                local_178 = (double)(int)(-(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                                         (double)dangle5_dH[k][l]);
              }
              else {
                local_178 = -(double)(dangle5_dH[k][l] - dangle5_37[k][l]) * dVar7 +
                            (double)dangle5_dH[k][l];
              }
              local_180 = -local_178;
            }
            local_168 = local_180;
          }
          else {
            local_168 = 0.0;
          }
          local_158 = local_168;
        }
        dVar8 = exp((local_158 * 10.0) / dVar6);
        pvVar4->expdangle5[k][l] = dVar8;
        if (iVar1 == 0) {
          if (0.0 <= -(double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                   (double)dangle3_dH[k][l])) {
            local_1a8 = -(double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                      (double)dangle3_dH[k][l]);
          }
          else {
            local_1a8 = 0.0;
          }
          local_1b8 = local_1a8;
        }
        else {
          if (iVar1 == 0) {
            local_1c0 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                     (double)dangle3_dH[k][l]);
          }
          else {
            local_1c0 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                        (double)dangle3_dH[k][l];
          }
          if (-1.2283697 <= -local_1c0 / 10.0) {
            if (iVar1 == 0) {
              local_1d0 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                       (double)dangle3_dH[k][l]);
            }
            else {
              local_1d0 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                          (double)dangle3_dH[k][l];
            }
            if (-local_1d0 / 10.0 <= 0.8660254) {
              if (iVar1 == 0) {
                local_1e8 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_1e8 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                            (double)dangle3_dH[k][l];
              }
              dVar8 = sin(-local_1e8 / 10.0 - 0.34242663);
              if (iVar1 == 0) {
                local_1f8 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_1f8 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                            (double)dangle3_dH[k][l];
              }
              dVar9 = sin(-local_1f8 / 10.0 - 0.34242663);
              local_1e0 = (dVar8 + 1.0) * 3.8490018 * (dVar9 + 1.0);
            }
            else {
              if (iVar1 == 0) {
                local_1d8 = (double)(int)(-(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                                         (double)dangle3_dH[k][l]);
              }
              else {
                local_1d8 = -(double)(dangle3_dH[k][l] - dangle3_37[k][l]) * dVar7 +
                            (double)dangle3_dH[k][l];
              }
              local_1e0 = -local_1d8;
            }
            local_1c8 = local_1e0;
          }
          else {
            local_1c8 = 0.0;
          }
          local_1b8 = local_1c8;
        }
        dVar8 = exp((local_1b8 * 10.0) / dVar6);
        pvVar4->expdangle3[k][l] = dVar8;
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      if (iVar1 == 0) {
        local_200 = (double)(int)(-(double)(stackdH[k][l] - stack37[k][l]) * dVar7 +
                                 (double)stackdH[k][l]);
      }
      else {
        local_200 = -(double)(stackdH[k][l] - stack37[k][l]) * dVar7 + (double)stackdH[k][l];
      }
      dVar8 = exp((-local_200 * 10.0) / dVar6);
      pvVar4->expstack[k][l] = dVar8;
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 5; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        if (iVar1 == 0) {
          local_208 = (double)(int)(-(double)(mismatchIdH[k][l][(uint)pf_smooth] -
                                             mismatchI37[k][l][(uint)pf_smooth]) * dVar7 +
                                   (double)mismatchIdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_208 = -(double)(mismatchIdH[k][l][(uint)pf_smooth] -
                               mismatchI37[k][l][(uint)pf_smooth]) * dVar7 +
                      (double)mismatchIdH[k][l][(uint)pf_smooth];
        }
        dVar8 = exp((-local_208 * 10.0) / dVar6);
        pvVar4->expmismatchI[k][l][(uint)pf_smooth] = dVar8;
        if (iVar1 == 0) {
          local_210 = (double)(int)(-(double)(mismatch1nIdH[k][l][(uint)pf_smooth] -
                                             mismatch1nI37[k][l][(uint)pf_smooth]) * dVar7 +
                                   (double)mismatch1nIdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_210 = -(double)(mismatch1nIdH[k][l][(uint)pf_smooth] -
                               mismatch1nI37[k][l][(uint)pf_smooth]) * dVar7 +
                      (double)mismatch1nIdH[k][l][(uint)pf_smooth];
        }
        dVar8 = exp((-local_210 * 10.0) / dVar6);
        pvVar4->expmismatch1nI[k][l][(uint)pf_smooth] = dVar8;
        if (iVar1 == 0) {
          local_218 = (double)(int)(-(double)(mismatchHdH[k][l][(uint)pf_smooth] -
                                             mismatchH37[k][l][(uint)pf_smooth]) * dVar7 +
                                   (double)mismatchHdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_218 = -(double)(mismatchHdH[k][l][(uint)pf_smooth] -
                               mismatchH37[k][l][(uint)pf_smooth]) * dVar7 +
                      (double)mismatchHdH[k][l][(uint)pf_smooth];
        }
        dVar8 = exp((-local_218 * 10.0) / dVar6);
        pvVar4->expmismatchH[k][l][(uint)pf_smooth] = dVar8;
        if (iVar1 == 0) {
          local_220 = (double)(int)(-(double)(mismatch23IdH[k][l][(uint)pf_smooth] -
                                             mismatch23I37[k][l][(uint)pf_smooth]) * dVar7 +
                                   (double)mismatch23IdH[k][l][(uint)pf_smooth]);
        }
        else {
          local_220 = -(double)(mismatch23IdH[k][l][(uint)pf_smooth] -
                               mismatch23I37[k][l][(uint)pf_smooth]) * dVar7 +
                      (double)mismatch23IdH[k][l][(uint)pf_smooth];
        }
        dVar8 = exp((-local_220 * 10.0) / dVar6);
        pvVar4->expmismatch23I[k][l][(uint)pf_smooth] = dVar8;
        if (md->dangles == 0) {
          pvVar4->expmismatchExt[k][l][(uint)pf_smooth] = 1.0;
          pvVar4->expmismatchM[k][l][(uint)pf_smooth] = 1.0;
        }
        else {
          if (iVar1 == 0) {
            if (0.0 <= -(double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                               mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                     (double)mismatchMdH[k][l][(uint)pf_smooth])) {
              local_230 = -(double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                  mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                        (double)mismatchMdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_230 = 0.0;
            }
            local_240 = local_230;
          }
          else {
            if (iVar1 == 0) {
              local_248 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                 mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                       (double)mismatchMdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_248 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                   mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                          (double)mismatchMdH[k][l][(uint)pf_smooth];
            }
            if (-1.2283697 <= -local_248 / 10.0) {
              if (iVar1 == 0) {
                local_258 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                   mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                         (double)mismatchMdH[k][l][(uint)pf_smooth]);
              }
              else {
                local_258 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                            (double)mismatchMdH[k][l][(uint)pf_smooth];
              }
              if (-local_258 / 10.0 <= 0.8660254) {
                if (iVar1 == 0) {
                  local_270 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_270 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                dVar8 = sin(-local_270 / 10.0 - 0.34242663);
                if (iVar1 == 0) {
                  local_280 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_280 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                dVar9 = sin(-local_280 / 10.0 - 0.34242663);
                local_268 = (dVar8 + 1.0) * 3.8490018 * (dVar9 + 1.0);
              }
              else {
                if (iVar1 == 0) {
                  local_260 = (double)(int)(-(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                                     mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchMdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_260 = -(double)(mismatchMdH[k][l][(uint)pf_smooth] -
                                       mismatchM37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchMdH[k][l][(uint)pf_smooth];
                }
                local_268 = -local_260;
              }
              local_250 = local_268;
            }
            else {
              local_250 = 0.0;
            }
            local_240 = local_250;
          }
          dVar8 = exp((local_240 * 10.0) / dVar6);
          pvVar4->expmismatchM[k][l][(uint)pf_smooth] = dVar8;
          if (iVar1 == 0) {
            if (0.0 <= -(double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                               mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                     (double)mismatchExtdH[k][l][(uint)pf_smooth])) {
              local_290 = -(double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                  mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                        (double)mismatchExtdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_290 = 0.0;
            }
            local_2a0 = local_290;
          }
          else {
            if (iVar1 == 0) {
              local_2a8 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                 mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                       (double)mismatchExtdH[k][l][(uint)pf_smooth]);
            }
            else {
              local_2a8 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                   mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                          (double)mismatchExtdH[k][l][(uint)pf_smooth];
            }
            if (-1.2283697 <= -local_2a8 / 10.0) {
              if (iVar1 == 0) {
                local_2b8 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                   mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                         (double)mismatchExtdH[k][l][(uint)pf_smooth]);
              }
              else {
                local_2b8 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                            (double)mismatchExtdH[k][l][(uint)pf_smooth];
              }
              if (-local_2b8 / 10.0 <= 0.8660254) {
                if (iVar1 == 0) {
                  local_2d0 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2d0 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                dVar8 = sin(-local_2d0 / 10.0 - 0.34242663);
                if (iVar1 == 0) {
                  local_2e0 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2e0 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                dVar9 = sin(-local_2e0 / 10.0 - 0.34242663);
                local_2c8 = (dVar8 + 1.0) * 3.8490018 * (dVar9 + 1.0);
              }
              else {
                if (iVar1 == 0) {
                  local_2c0 = (double)(int)(-(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                                     mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                                           (double)mismatchExtdH[k][l][(uint)pf_smooth]);
                }
                else {
                  local_2c0 = -(double)(mismatchExtdH[k][l][(uint)pf_smooth] -
                                       mismatchExt37[k][l][(uint)pf_smooth]) * dVar7 +
                              (double)mismatchExtdH[k][l][(uint)pf_smooth];
                }
                local_2c8 = -local_2c0;
              }
              local_2b0 = local_2c8;
            }
            else {
              local_2b0 = 0.0;
            }
            local_2a0 = local_2b0;
          }
          dVar8 = exp((local_2a0 * 10.0) / dVar6);
          pvVar4->expmismatchExt[k][l][(uint)pf_smooth] = dVar8;
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
          if (iVar1 == 0) {
            local_2e8 = (double)(int)(-(double)(int11_dH[k][l][(uint)pf_smooth][local_30] -
                                               int11_37[k][l][(uint)pf_smooth][local_30]) * dVar7 +
                                     (double)int11_dH[k][l][(uint)pf_smooth][local_30]);
          }
          else {
            local_2e8 = -(double)(int11_dH[k][l][(uint)pf_smooth][local_30] -
                                 int11_37[k][l][(uint)pf_smooth][local_30]) * dVar7 +
                        (double)int11_dH[k][l][(uint)pf_smooth][local_30];
          }
          dVar8 = exp((-local_2e8 * 10.0) / dVar6);
          pvVar4->expint11[k][l][(uint)pf_smooth][local_30] = dVar8;
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
          for (n = 0; n < 5; n = n + 1) {
            if (iVar1 == 0) {
              local_2f0 = (double)(int)(-(double)(int21_dH[k][l][(uint)pf_smooth][local_30][n] -
                                                 int21_37[k][l][(uint)pf_smooth][local_30][n]) *
                                        dVar7 + (double)int21_dH[k][l][(uint)pf_smooth][local_30][n]
                                       );
            }
            else {
              local_2f0 = -(double)(int21_dH[k][l][(uint)pf_smooth][local_30][n] -
                                   int21_37[k][l][(uint)pf_smooth][local_30][n]) * dVar7 +
                          (double)int21_dH[k][l][(uint)pf_smooth][local_30][n];
            }
            dVar8 = exp((-local_2f0 * 10.0) / dVar6);
            pvVar4->expint21[k][l][(uint)pf_smooth][local_30][n] = dVar8;
          }
        }
      }
    }
  }
  for (k = 0; k < 8; k = k + 1) {
    for (l = 0; l < 8; l = l + 1) {
      for (pf_smooth = 0; (uint)pf_smooth < 5; pf_smooth = pf_smooth + 1) {
        for (local_30 = 0; local_30 < 5; local_30 = local_30 + 1) {
          for (local_70 = 0; local_70 < 5; local_70 = local_70 + 1) {
            for (local_74 = 0; local_74 < 5; local_74 = local_74 + 1) {
              if (iVar1 == 0) {
                local_2f8 = (double)(int)(-(double)(int22_dH[k][l][(uint)pf_smooth][local_30]
                                                    [local_70][local_74] -
                                                   int22_37[k][l][(uint)pf_smooth][local_30]
                                                   [local_70][local_74]) * dVar7 +
                                         (double)int22_dH[k][l][(uint)pf_smooth][local_30][local_70]
                                                 [local_74]);
              }
              else {
                local_2f8 = -(double)(int22_dH[k][l][(uint)pf_smooth][local_30][local_70][local_74]
                                     - int22_37[k][l][(uint)pf_smooth][local_30][local_70][local_74]
                                     ) * dVar7 +
                            (double)int22_dH[k][l][(uint)pf_smooth][local_30][local_70][local_74];
              }
              dVar8 = exp((-local_2f8 * 10.0) / dVar6);
              pvVar4->expint22[k][l][(uint)pf_smooth][local_30][local_70][local_74] = dVar8;
            }
          }
        }
      }
    }
  }
  strncpy(pvVar4->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar4->Triloops,Triloops,0xf1);
  strncpy(pvVar4->Hexaloops,Hexaloops,0x169);
  return pvVar4;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_exp_params_ali(vrna_md_t    *md,
                   unsigned int n_seq,
                   double       pfs)
{
  /* scale energy parameters and pre-calculate Boltzmann weights */
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kTn, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf                = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
  pf->model_details = *md;
  pf->alpha         = md->betaScale;
  pf->temperature   = md->temperature;
  pf->pf_scale      = pfs;
  pf->kT            = kTn = ((double)n_seq) * md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kTn);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kTn);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kTn / n_seq);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kTn);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kTn);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kTn);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kTn);
  /*add penalty for too short hairpins*/
  for (i = 0; i < 3; i++) {
    GT                = 600 /*Penalty*/ * TT;
    pf->exphairpin[i] = exp(-GT * 10. / kTn);
  }

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kTn);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kTn);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kTn);

  GT = RESCALE_dG(bulge37[30], bulgedH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(internal_loop37[30], internal_loopdH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * GT) * 10. / kTn);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kTn);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kTn);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kTn);

  for (i = 0; i <= NBPAIRS; i++)
    /* includes AU penalty */
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kTn);

  /* if dangle_model==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j] = RESCALE_BF_SMOOTH(dangle5_37[i][j],
                                                 dangle5_dH[i][j],
                                                 TT,
                                                 kTn);
        pf->expdangle3[i][j] = RESCALE_BF_SMOOTH(dangle3_37[i][j],
                                                 dangle3_dH[i][j],
                                                 TT,
                                                 kTn);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++) {
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j],
                                      stackdH[i][j],
                                      TT,
                                      kTn);
    }

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kTn);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kTn);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kTn);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kTn);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kTn);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kTn);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kTn);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}